

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall caffe::ConvolutionParameter::SharedCtor(ConvolutionParameter *this)

{
  this->_cached_size_ = 0;
  this->weight_filler_ = (FillerParameter *)0x0;
  this->bias_filler_ = (FillerParameter *)0x0;
  this->num_output_ = 0;
  this->pad_h_ = 0;
  this->pad_w_ = 0;
  this->kernel_h_ = 0;
  this->kernel_w_ = 0;
  this->stride_h_ = 0;
  this->stride_w_ = 0;
  this->engine_ = 0;
  this->force_nd_im2col_ = false;
  this->axis_ = 1;
  this->bias_term_ = true;
  this->group_ = 1;
  return;
}

Assistant:

void ConvolutionParameter::SharedCtor() {
  _cached_size_ = 0;
  ::memset(&weight_filler_, 0, reinterpret_cast<char*>(&force_nd_im2col_) -
    reinterpret_cast<char*>(&weight_filler_) + sizeof(force_nd_im2col_));
  axis_ = 1;
  bias_term_ = true;
  group_ = 1u;
}